

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.h
# Opt level: O2

void __thiscall dh::trival::~trival(trival *this)

{
  std::__cxx11::string::~string((string *)&this->_val2);
  std::__cxx11::string::~string((string *)&this->_val1);
  std::__cxx11::string::~string((string *)&this->_operand);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

trival( ::std::string operand)
		{
			this->_operand = operand;
			size = 0;
		}